

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O3

void __thiscall icu_63::ServiceEnumeration::reset(ServiceEnumeration *this,UErrorCode *status)

{
  int32_t iVar1;
  
  if (*status == U_ENUM_OUT_OF_SYNC_ERROR) {
    *status = U_ZERO_ERROR;
  }
  else if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar1 = ICUService::getTimestamp(&this->_service->super_ICUService);
  this->_timestamp = iVar1;
  this->_pos = 0;
  ICUService::getVisibleIDs(&this->_service->super_ICUService,&this->_ids,status);
  return;
}

Assistant:

virtual void reset(UErrorCode& status) {
        if (status == U_ENUM_OUT_OF_SYNC_ERROR) {
            status = U_ZERO_ERROR;
        }
        if (U_SUCCESS(status)) {
            _timestamp = _service->getTimestamp();
            _pos = 0;
            _service->getVisibleIDs(_ids, status);
        }
    }